

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  byte bVar1;
  uint uVar2;
  nk_plugin_alloc p_Var3;
  uchar *puVar4;
  nk_font *pnVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  uint uVar9;
  nk_font_config *pnVar10;
  ulong uVar11;
  uchar *old_i;
  ushort *puVar12;
  ushort *puVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  byte bVar17;
  nk_font_config local_88;
  
  bVar17 = 0;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3549,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x354a,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x354b,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  p_Var3 = (atlas->permanent).alloc;
  if (p_Var3 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x354c,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x354d,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_data == (void *)0x0) {
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x354f,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_size == 0) {
    __assert_fail("compressed_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3550,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar2 = *(uint *)((long)compressed_data + 8);
  uVar14 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  puVar4 = (uchar *)(*p_Var3)((atlas->permanent).userdata,(void *)0x0,(nk_size)uVar14);
  if (puVar4 == (uchar *)0x0) {
    __assert_fail("decompressed_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3557,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar15 = *compressed_data;
  if (((uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18) ==
       0x57bc0000) &&
     (uVar15 = *(uint *)((long)compressed_data + 4),
     ((uVar15 >> 0x18 == 0 && (uVar15 & 0xff0000) == 0) && (uVar15 & 0xff00) == 0) &&
     (uVar15 & 0xff) == 0)) {
    uVar15 = *(uint *)((long)compressed_data + 8);
    uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
    puVar8 = puVar4 + uVar15;
    puVar12 = (ushort *)((long)compressed_data + 0x10);
    nk__barrier2 = (uchar *)compressed_data;
    nk__barrier = puVar8;
    nk__barrier4 = puVar4;
    nk__dout = puVar4;
    do {
      bVar1 = (byte)*puVar12;
      uVar9 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                nk__match(nk__dout +
                          ~((ulong)*(byte *)((long)puVar12 + 3) |
                            (ulong)*(byte *)((long)puVar12 + 1) << 0x10 |
                           (ulong)(byte)puVar12[1] << 8),
                          (ushort)(puVar12[2] << 8 | puVar12[2] >> 8) + 1);
                puVar13 = puVar12 + 3;
              }
              else {
                if (uVar9 == 6) {
                  uVar11 = ~((ulong)*(byte *)((long)puVar12 + 3) |
                             (ulong)*(byte *)((long)puVar12 + 1) << 0x10 |
                            (ulong)(byte)puVar12[1] << 8);
                  uVar9 = (uint)(byte)puVar12[2];
                  goto LAB_00116b20;
                }
                puVar13 = puVar12;
                if (uVar9 == 7) {
                  nk__lit((byte *)((long)puVar12 + 3),
                          (ushort)(*(ushort *)((long)puVar12 + 1) << 8 |
                                  *(ushort *)((long)puVar12 + 1) >> 8) + 1);
                  puVar13 = (ushort *)
                            ((long)puVar12 +
                            (ulong)(ushort)(*(ushort *)((long)puVar12 + 1) << 8 |
                                           *(ushort *)((long)puVar12 + 1) >> 8) + 4);
                }
              }
            }
            else {
              nk__lit((uchar *)(puVar12 + 1),
                      ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar12 + 1)) - 0x7ff);
              puVar13 = (ushort *)
                        ((long)puVar12 + ((ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8) - 0x7fd));
            }
          }
          else {
            uVar11 = -(ulong)(((uint)*(byte *)((long)puVar12 + 1) * 0x100 +
                              ((uint)(byte)puVar12[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar9 = (uint)(ushort)(*(ushort *)((long)puVar12 + 3) << 8 |
                                  *(ushort *)((long)puVar12 + 3) >> 8);
LAB_00116b20:
            nk__match(nk__dout + uVar11,uVar9 + 1);
            puVar13 = (ushort *)((long)puVar12 + 5);
          }
        }
        else {
          nk__match(nk__dout +
                    -(ulong)(((uint)*(byte *)((long)puVar12 + 1) * 0x100 +
                             ((uint)(byte)puVar12[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                    *(byte *)((long)puVar12 + 3) + 1);
          puVar13 = puVar12 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar12 + 1),uVar9 - 0x7f);
        puVar13 = puVar12 + 1;
      }
      else if (bVar1 < 0x40) {
        nk__lit((byte *)((long)puVar12 + 1),uVar9 - 0x1f);
        puVar13 = (ushort *)((long)puVar12 + ((ulong)(byte)*puVar12 - 0x1e));
      }
      else {
        nk__match(nk__dout +
                  -(ulong)(((uint)*(byte *)((long)puVar12 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                  (byte)puVar12[1] + 1);
        puVar13 = (ushort *)((long)puVar12 + 3);
      }
      if (puVar13 == puVar12) {
        if (((byte)*puVar13 != 5) || (*(byte *)((long)puVar13 + 1) != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3441,
                        "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
        uVar9 = uVar15;
        uVar11 = (ulong)(uVar15 % 0x15b0);
        if (nk__dout != puVar8) {
          __assert_fail("nk__dout == output + olen",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x343b,
                        "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
        while (uVar9 != 0) {
          if (7 < uVar11) {
            uVar7 = 7;
            do {
              uVar7 = uVar7 + 8;
            } while (uVar7 < uVar11);
          }
          uVar9 = uVar9 - (int)uVar11;
          uVar11 = 0x15b0;
        }
      }
      else if (puVar8 < nk__dout) {
        __assert_fail("nk__dout <= output + olen",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x3445,
                      "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)");
      }
      bVar16 = puVar13 != puVar12;
      puVar12 = puVar13;
    } while (bVar16);
  }
  if (config == (nk_font_config *)0x0) {
    local_88.padding[2] = '\0';
    local_88.padding[0] = '\0';
    local_88.padding[1] = '\0';
    local_88.next = (nk_font_config *)0x0;
    local_88.merge_mode = '\0';
    local_88.pixel_snap = '\0';
    local_88.oversample_v = '\x01';
    local_88.oversample_h = '\x03';
    local_88.coord_type = NK_COORD_UV;
    local_88.spacing.x = 0.0;
    local_88.spacing.y = 0.0;
    local_88.range = nk_font_default_glyph_ranges::ranges;
    local_88.font = (nk_baked_font *)0x0;
    local_88.fallback_glyph = 0x3f;
    local_88.p._4_4_ = 0;
    local_88._68_8_ = 0;
    local_88._76_8_ = 0;
  }
  else {
    pnVar10 = &local_88;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      pnVar10->next = config->next;
      config = (nk_font_config *)((long)config + (ulong)bVar17 * -0x10 + 8);
      pnVar10 = (nk_font_config *)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 8);
    }
  }
  local_88.ttf_blob._0_1_ = SUB81(puVar4,0);
  local_88.ttf_blob._1_7_ = (undefined7)((ulong)puVar4 >> 8);
  local_88.ttf_size._0_1_ = (undefined1)(uVar2 >> 0x18);
  local_88.ttf_size._1_4_ = uVar14 >> 8;
  local_88.ttf_size._5_2_ = 0;
  local_88.ttf_size._7_1_ = 0;
  local_88.ttf_data_owned_by_atlas = '\x01';
  local_88.size = height;
  pnVar5 = nk_font_atlas_add(atlas,&local_88);
  return pnVar5;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
    void *compressed_data, nk_size compressed_size, float height,
    const struct nk_font_config *config)
{
    unsigned int decompressed_size;
    void *decompressed_data;
    struct nk_font_config cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(compressed_data);
    NK_ASSERT(compressed_size);
    if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
    decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
    NK_ASSERT(decompressed_data);
    if (!decompressed_data) return 0;
    nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
        (unsigned int)compressed_size);

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = decompressed_data;
    cfg.ttf_size = decompressed_size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 1;
    return nk_font_atlas_add(atlas, &cfg);
}